

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::func_decl(analysis *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar6;
  undefined1 local_198 [36];
  int local_174 [2];
  undefined1 local_169;
  undefined1 local_168 [8];
  string tmp_str;
  undefined1 local_140 [4];
  int lineno;
  token local_120;
  token local_f8;
  token local_d0;
  token local_a8;
  token local_80;
  int local_4c;
  undefined1 local_48 [32];
  undefined1 local_28 [8];
  NodePtr tmp_ptr;
  analysis *this_local;
  NodePtr *ret;
  
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_((token *)local_48);
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  local_4c = token::getLineno(peVar3);
  std::make_shared<dh::TreeNode,std::__cxx11::string,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
             (int *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_(&local_80);
  bVar1 = std::operator==(&local_80._val,"int");
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    local_a8._lineno = 2;
    TreeNode::setType(peVar4,&local_a8._lineno);
  }
  else {
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RSI->tmp);
    token::getVal_abi_cxx11_(&local_a8);
    bVar1 = std::operator==(&local_a8._val,"float");
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      local_d0._lineno = 3;
      TreeNode::setType(peVar4,&local_d0._lineno);
    }
    else {
      std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &in_RSI->tmp);
      token::getVal_abi_cxx11_(&local_d0);
      bVar1 = std::operator==(&local_d0._val,"void");
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar1) {
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        local_f8._lineno = 4;
        TreeNode::setType(peVar4,&local_f8._lineno);
      }
      else {
        std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &in_RSI->tmp);
        token::getVal_abi_cxx11_(&local_f8);
        bVar1 = std::operator==(&local_f8._val,"boolean");
        std::__cxx11::string::~string((string *)&local_f8);
        if (!bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"[ERROR] Unexpected type \"");
          std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &in_RSI->tmp);
          token::getVal_abi_cxx11_(&local_120);
          poVar5 = std::operator<<(poVar5,(string *)&local_120);
          poVar5 = std::operator<<(poVar5,"\" in line ");
          peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&in_RSI->tmp);
          iVar2 = token::getLineno(peVar3);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_120);
          exit(1);
        }
        peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        local_120._lineno = 0;
        TreeNode::setType(peVar4,&local_120._lineno);
      }
    }
  }
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &in_RSI->tmp);
  token::getVal_abi_cxx11_((token *)local_140);
  match(in_RSI,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  peVar3 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  token::getLineno(peVar3);
  identifier_abi_cxx11_((analysis *)local_168);
  local_169 = 0;
  std::make_shared<dh::TreeNode,std::__cxx11::string&,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (int *)local_168);
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_174[1] = 0;
  TreeNode::setNodeKind(peVar4,local_174 + 1);
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_174[0] = 0;
  TreeNode::setKind(peVar4,local_174);
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar4,(NodePtr *)local_28);
  para_list((analysis *)(local_198 + 0x10));
  std::shared_ptr<dh::TreeNode>::operator=
            ((shared_ptr<dh::TreeNode> *)local_28,(shared_ptr<dh::TreeNode> *)(local_198 + 0x10));
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)(local_198 + 0x10));
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar4,(shared_ptr<dh::TreeNode> *)local_28);
  in_RSI->layer_record = in_RSI->layer_record + 1;
  compound_stmt((analysis *)local_198);
  std::shared_ptr<dh::TreeNode>::operator=
            ((shared_ptr<dh::TreeNode> *)local_28,(shared_ptr<dh::TreeNode> *)local_198);
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_198);
  in_RSI->layer_record = in_RSI->layer_record + -1;
  peVar4 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar4,(shared_ptr<dh::TreeNode> *)local_28);
  local_169 = 1;
  std::__cxx11::string::~string((string *)local_168);
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_28);
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::func_decl()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in func_decl, get type " << tmp->getVal() << ::std::endl;
#endif
	
	NodePtr tmp_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
	if ( tmp->getVal() == "int")
	{
		tmp_ptr->setType(TypeKind::IntK);
	} else if ( tmp->getVal() == "float")
	{
		tmp_ptr->setType(TypeKind::FloatK); 
	} else if ( tmp->getVal() == "void")
	{
		tmp_ptr->setType(TypeKind::VoidK);
	} else if (tmp->getVal() == "boolean")
	{
		tmp_ptr->setType(TypeKind::BoolK);
	} else 
	{
		::std::cerr << "[ERROR] Unexpected type \""
			<< tmp->getVal() 
			<< "\" in line "
			<< tmp->getLineno()
			<< ::std::endl;
		::std::exit(1);
	}
	match(tmp->getVal());

	int lineno = tmp->getLineno();
	::std::string tmp_str = identifier();
	NodePtr ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
	ret->setNodeKind(NodeKind::DeclK);
	ret->setKind(DeclKind::FuncK);
	ret->appendChild(tmp_ptr);

	tmp_ptr = para_list();
	ret->appendChild(tmp_ptr);

	this->layer_record++;
	tmp_ptr = compound_stmt();
	this->layer_record--;

	ret->appendChild(tmp_ptr);
	return ret;
}